

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iouring-pollhup.c
# Opt level: O2

void read_data2(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  int64_t eval_b;
  int64_t eval_a;
  
  eval_a = nread;
  if (nread < 0) {
    eval_b = -0xfff;
    if (nread == -0xfff) {
      iVar1 = close(duped_fd);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        duped_fd = -1;
        uv_close((uv_handle_t *)&p2,(uv_close_cb)0x0);
        uv_close((uv_handle_t *)&idle_handle,(uv_close_cb)0x0);
        return;
      }
      pcVar3 = "==";
      pcVar4 = "0";
      pcVar2 = "close(duped_fd)";
      uVar5 = 0x36;
    }
    else {
      pcVar3 = "==";
      pcVar4 = "UV_EOF";
      pcVar2 = "nread";
      uVar5 = 0x35;
    }
  }
  else {
    eval_b = 0;
    if (0 < nread) {
      return;
    }
    pcVar3 = ">";
    pcVar4 = "0";
    pcVar2 = "nread";
    uVar5 = 0x3f;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-iouring-pollhup.c"
          ,uVar5,pcVar2,pcVar3,pcVar4,eval_a,pcVar3,eval_b);
  abort();
}

Assistant:

static void read_data2(uv_stream_t* stream,
                       ssize_t nread,
                       const uv_buf_t* buf) {
  if (nread < 0) {
    ASSERT_EQ(nread, UV_EOF);
    ASSERT_OK(close(duped_fd));
    duped_fd = -1;
    uv_close((uv_handle_t*) &p2, NULL);
    uv_close((uv_handle_t*) &idle_handle, NULL);
  } else {
    /* If nread == 0 is because of POLLHUP received still from pipefds[0] file
     * description which is still referenced in duped_fd. It should not happen
     * if close(p1) was called after EPOLL_CTL_DEL.
     */
    ASSERT_GT(nread, 0);
  }
}